

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

void * Highs_getCallbackDataOutItem(HighsCallbackDataOut *data_out,char *item_name)

{
  int iVar1;
  
  iVar1 = strcmp(item_name,"log_type");
  if (iVar1 != 0) {
    iVar1 = strcmp(item_name,"running_time");
    if (iVar1 == 0) {
      data_out = (HighsCallbackDataOut *)&data_out->running_time;
    }
    else {
      iVar1 = strcmp(item_name,"simplex_iteration_count");
      if (iVar1 == 0) {
        data_out = (HighsCallbackDataOut *)&data_out->simplex_iteration_count;
      }
      else {
        iVar1 = strcmp(item_name,"ipm_iteration_count");
        if (iVar1 == 0) {
          data_out = (HighsCallbackDataOut *)&data_out->ipm_iteration_count;
        }
        else {
          iVar1 = strcmp(item_name,"pdlp_iteration_count");
          if (iVar1 == 0) {
            data_out = (HighsCallbackDataOut *)&data_out->pdlp_iteration_count;
          }
          else {
            iVar1 = strcmp(item_name,"objective_function_value");
            if (iVar1 == 0) {
              data_out = (HighsCallbackDataOut *)&data_out->objective_function_value;
            }
            else {
              iVar1 = strcmp(item_name,"mip_node_count");
              if (iVar1 == 0) {
                data_out = (HighsCallbackDataOut *)&data_out->mip_node_count;
              }
              else {
                iVar1 = strcmp(item_name,"mip_total_lp_iterations");
                if (iVar1 == 0) {
                  data_out = (HighsCallbackDataOut *)&data_out->mip_total_lp_iterations;
                }
                else {
                  iVar1 = strcmp(item_name,"mip_primal_bound");
                  if (iVar1 == 0) {
                    data_out = (HighsCallbackDataOut *)&data_out->mip_primal_bound;
                  }
                  else {
                    iVar1 = strcmp(item_name,"mip_dual_bound");
                    if (iVar1 == 0) {
                      data_out = (HighsCallbackDataOut *)&data_out->mip_dual_bound;
                    }
                    else {
                      iVar1 = strcmp(item_name,"mip_gap");
                      if (iVar1 == 0) {
                        data_out = (HighsCallbackDataOut *)&data_out->mip_gap;
                      }
                      else {
                        iVar1 = strcmp(item_name,"mip_solution");
                        if (iVar1 == 0) {
                          data_out = (HighsCallbackDataOut *)data_out->mip_solution;
                        }
                        else {
                          iVar1 = strcmp(item_name,"cutpool_num_col");
                          if (iVar1 == 0) {
                            data_out = (HighsCallbackDataOut *)&data_out->cutpool_num_col;
                          }
                          else {
                            iVar1 = strcmp(item_name,"cutpool_num_cut");
                            if (iVar1 == 0) {
                              data_out = (HighsCallbackDataOut *)&data_out->cutpool_num_cut;
                            }
                            else {
                              iVar1 = strcmp(item_name,"cutpool_num_nz");
                              if (iVar1 == 0) {
                                data_out = (HighsCallbackDataOut *)&data_out->cutpool_num_nz;
                              }
                              else {
                                iVar1 = strcmp(item_name,"cutpool_start");
                                if (iVar1 == 0) {
                                  data_out = (HighsCallbackDataOut *)data_out->cutpool_start;
                                }
                                else {
                                  iVar1 = strcmp(item_name,"cutpool_index");
                                  if (iVar1 == 0) {
                                    data_out = (HighsCallbackDataOut *)data_out->cutpool_index;
                                  }
                                  else {
                                    iVar1 = strcmp(item_name,"cutpool_value");
                                    if (iVar1 == 0) {
                                      data_out = (HighsCallbackDataOut *)data_out->cutpool_value;
                                    }
                                    else {
                                      iVar1 = strcmp(item_name,"cutpool_lower");
                                      if (iVar1 == 0) {
                                        data_out = (HighsCallbackDataOut *)data_out->cutpool_lower;
                                      }
                                      else {
                                        iVar1 = strcmp(item_name,"cutpool_upper");
                                        if (iVar1 == 0) {
                                          data_out = (HighsCallbackDataOut *)data_out->cutpool_upper
                                          ;
                                        }
                                        else {
                                          data_out = (HighsCallbackDataOut *)0x0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return data_out;
}

Assistant:

const void* Highs_getCallbackDataOutItem(const HighsCallbackDataOut* data_out,
                                         const char* item_name) {
  // Accessor function for HighsCallbackDataOut
  //
  // Remember that pointers in HighsCallbackDataOut don't need to be referenced!
  if (!strcmp(item_name, kHighsCallbackDataOutLogTypeName)) {
    return (void*)(&data_out->log_type);
  } else if (!strcmp(item_name, kHighsCallbackDataOutRunningTimeName)) {
    return (void*)(&data_out->running_time);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutSimplexIterationCountName)) {
    return (void*)(&data_out->simplex_iteration_count);
  } else if (!strcmp(item_name, kHighsCallbackDataOutIpmIterationCountName)) {
    return (void*)(&data_out->ipm_iteration_count);
  } else if (!strcmp(item_name, kHighsCallbackDataOutPdlpIterationCountName)) {
    return (void*)(&data_out->pdlp_iteration_count);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutObjectiveFunctionValueName)) {
    return (void*)(&data_out->objective_function_value);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipNodeCountName)) {
    return (void*)(&data_out->mip_node_count);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutMipTotalLpIterationsName)) {
    return (void*)(&data_out->mip_total_lp_iterations);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipPrimalBoundName)) {
    return (void*)(&data_out->mip_primal_bound);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipDualBoundName)) {
    return (void*)(&data_out->mip_dual_bound);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipGapName)) {
    return (void*)(&data_out->mip_gap);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipSolutionName)) {
    return (void*)(data_out->mip_solution);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumColName)) {
    return (void*)(&data_out->cutpool_num_col);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumCutName)) {
    return (void*)(&data_out->cutpool_num_cut);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumNzName)) {
    return (void*)(&data_out->cutpool_num_nz);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolStartName)) {
    return (void*)(data_out->cutpool_start);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolIndexName)) {
    return (void*)(data_out->cutpool_index);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolValueName)) {
    return (void*)(data_out->cutpool_value);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolLowerName)) {
    return (void*)(data_out->cutpool_lower);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolUpperName)) {
    return (void*)(data_out->cutpool_upper);
  }
  return nullptr;
}